

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticPrism>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticPrism> *this,
          TPZGeoElRefLess<pzgeom::TPZQuadraticPrism> *gel)

{
  long lVar1;
  int64_t *piVar2;
  int64_t *piVar3;
  byte bVar4;
  TPZGeoElSide gelside;
  TPZGeoElSide thisside;
  
  bVar4 = 0;
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016d9cc8;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016d9920,&gel->super_TPZGeoEl);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016d9620;
  (this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.super_TPZPrism.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_016d8980;
  piVar2 = (gel->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes;
  piVar3 = (this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes;
  for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
    *piVar3 = *piVar2;
    piVar2 = piVar2 + (ulong)bVar4 * -2 + 1;
    piVar3 = piVar3 + (ulong)bVar4 * -2 + 1;
  }
  (this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.super_TPZPrism.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZQuadraticPrism_016d88f8;
  lVar1 = 0xd0;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes + lVar1 + -0x58) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes + lVar1 + -0x48) =
         0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes + lVar1 + -0x50) =
         0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x2c8);
  for (lVar1 = 0xc0; lVar1 != 0x2b8; lVar1 = lVar1 + 0x18) {
    TPZGeoElSide::TPZGeoElSide
              (&thisside,
               (TPZGeoElSideIndex *)
               ((long)(this->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes +
               lVar1 + -0x48),(this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::TPZGeoElSide
              (&gelside,(TPZGeoElSideIndex *)
                        ((long)(gel->fGeo).super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes +
                        lVar1 + -0x48),(this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::SetConnectivity(&thisside,&gelside);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(const TPZGeoElRefLess<TGeo>  &gel)
:TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(gel), fGeo(gel.fGeo){
	int i;
	for(i=0;i<TGeo::NSides;i++){
		TPZGeoElSide thisside(this->fNeighbours[i], this->Mesh());
		TPZGeoElSide gelside(gel.fNeighbours[i], this->Mesh());
		thisside.SetConnectivity(gelside);
		//     fNeighbours[i].SetConnectivity(gel.fNeighbours[i]);
	}
	//  fSubElement = -1;
}